

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O3

void __thiscall VDasher::cubicTo(VDasher *this,VPointF *cp1,VPointF *cp2,VPointF *e)

{
  VPointF *pVVar1;
  ulong uVar2;
  Dash *pDVar3;
  byte bVar4;
  float fVar5;
  float len;
  float fVar6;
  VBezier b;
  VBezier right;
  VBezier left;
  VPointF local_b8;
  VPointF local_b0;
  VPointF local_a8;
  VPointF *local_a0;
  VPointF local_98;
  VPointF VStack_90;
  VPointF local_88;
  VPointF VStack_80;
  VPointF local_70;
  VPointF VStack_68;
  VPointF local_60;
  VPointF VStack_58;
  undefined1 local_50 [16];
  VPointF local_40;
  VPointF VStack_38;
  
  VBezier::fromPoints(&this->mCurPt,cp1,cp2,e);
  fVar5 = VBezier::length((VBezier *)&local_98);
  fVar6 = this->mCurrentLength;
  local_a0 = e;
  if (fVar5 <= fVar6) {
    this->mCurrentLength = fVar6 - fVar5;
    addCubic(this,cp1,cp2,e);
  }
  else {
    if (fVar6 < fVar5) {
      len = fVar6;
      do {
        VBezier::splitAtLength((VBezier *)&local_98,len,(VBezier *)local_50,(VBezier *)&local_70);
        local_a8.mx = (float)local_50._8_4_;
        local_a8.my = (float)local_50._12_4_;
        local_b0 = local_40;
        local_b8 = VStack_38;
        addCubic(this,&local_a8,&local_b0,&local_b8);
        bVar4 = this->mDiscard;
        uVar2 = this->mIndex;
        do {
          bVar4 = (bVar4 & 1) == 0;
          if ((bool)bVar4) {
            pDVar3 = (Dash *)&this->mDashArray[uVar2].gap;
          }
          else {
            uVar2 = (uVar2 + 1) % this->mArraySize;
            this->mIndex = uVar2;
            pDVar3 = this->mDashArray + uVar2;
          }
          fVar6 = pDVar3->length;
          this->mCurrentLength = fVar6;
        } while (ABS(fVar6) <= 1e-06);
        this->mDiscard = (bool)bVar4;
        fVar5 = fVar5 - len;
        this->mStartNewSegment = true;
        local_98 = local_70;
        VStack_90 = VStack_68;
        local_88 = local_60;
        VStack_80 = VStack_58;
        this->mCurPt = local_70;
        len = fVar6;
      } while (fVar6 < fVar5);
    }
    pVVar1 = local_a0;
    if (fVar5 <= 0.1) goto LAB_0010cfe4;
    this->mCurrentLength = fVar6 - fVar5;
    local_a8 = VStack_90;
    local_b0 = local_88;
    local_b8 = VStack_80;
    addCubic(this,&local_a8,&local_b0,&local_b8);
    local_a0 = pVVar1;
  }
  fVar6 = this->mCurrentLength;
LAB_0010cfe4:
  if (fVar6 < 0.1) {
    bVar4 = this->mDiscard;
    uVar2 = this->mIndex;
    do {
      bVar4 = (bVar4 & 1) == 0;
      if ((bool)bVar4) {
        pDVar3 = (Dash *)&this->mDashArray[uVar2].gap;
      }
      else {
        uVar2 = (uVar2 + 1) % this->mArraySize;
        this->mIndex = uVar2;
        pDVar3 = this->mDashArray + uVar2;
      }
      fVar6 = pDVar3->length;
      this->mCurrentLength = fVar6;
    } while (ABS(fVar6) <= 1e-06);
    this->mDiscard = (bool)bVar4;
    this->mStartNewSegment = true;
  }
  this->mCurPt = *local_a0;
  return;
}

Assistant:

void VDasher::cubicTo(const VPointF &cp1, const VPointF &cp2, const VPointF &e)
{
    VBezier left, right;
    VBezier b = VBezier::fromPoints(mCurPt, cp1, cp2, e);
    float   bezLen = b.length();

    if (bezLen <= mCurrentLength) {
        mCurrentLength -= bezLen;
        addCubic(cp1, cp2, e);
    } else {
        while (bezLen > mCurrentLength) {
            bezLen -= mCurrentLength;
            b.splitAtLength(mCurrentLength, &left, &right);

            addCubic(left.pt2(), left.pt3(), left.pt4());
            updateActiveSegment();

            b = right;
            mCurPt = b.pt1();
        }
        // handle remainder
        if (bezLen > tolerance) {
            mCurrentLength -= bezLen;
            addCubic(b.pt2(), b.pt3(), b.pt4());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = e;
}